

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidation_tests.cpp
# Opt level: O1

CTransactionRef __thiscall
txvalidation_tests::make_tx
          (txvalidation_tests *this,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,
          int32_t version)

{
  uchar *puVar1;
  uchar *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  pointer pCVar7;
  long lVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar9;
  long in_FS_OFFSET;
  CTransactionRef CVar10;
  CMutableTransaction mtx;
  CMutableTransaction local_98;
  uchar local_59;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_98);
  local_98.version = version;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&local_98.vin,
             ((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_98.vout,0x19);
  pCVar7 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar7) {
    lVar6 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      *(undefined4 *)
       ((long)(&((local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar6) =
           *(undefined4 *)((long)(&pCVar7->hash + 1) + lVar8);
      puVar1 = (pCVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar8;
      uVar3 = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 8);
      puVar1 = (pCVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar8 + 0x10;
      uVar5 = *(undefined8 *)(puVar1 + 8);
      puVar2 = ((local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar6 + 0x10;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 8) = uVar5;
      puVar1 = ((local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar6;
      *(undefined8 *)puVar1 = uVar3;
      *(undefined8 *)(puVar1 + 8) = uVar4;
      uVar9 = uVar9 + 1;
      pCVar7 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x24;
      lVar6 = lVar6 + 0x68;
    } while (uVar9 < (ulong)(((long)(inputs->
                                    super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 2) *
                            -0x71c71c71c71c71c7));
  }
  lVar6 = 8;
  do {
    local_58._16_8_ = 0;
    stack0xffffffffffffffc0 = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    local_59 = 'Q';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
               &local_59);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar6),
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
    if (0x1c < uStack_3c) {
      free((void *)local_58._0_8_);
      local_58._0_8_ = (char *)0x0;
    }
    *(undefined8 *)
     ((long)local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar6 + -8) = 10000;
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3f0);
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(CTransaction **)this,
             (allocator<CTransaction> *)local_58,&local_98);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_98.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_98.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  CVar10.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar10.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CTransactionRef)CVar10.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<COutPoint>& inputs, int32_t version)
{
    CMutableTransaction mtx = CMutableTransaction{};
    mtx.version = version;
    mtx.vin.resize(inputs.size());
    mtx.vout.resize(25);
    for (size_t i{0}; i < inputs.size(); ++i) {
        mtx.vin[i].prevout = inputs[i];
    }
    for (auto i{0}; i < 25; ++i) {
        mtx.vout[i].scriptPubKey = CScript() << OP_TRUE;
        mtx.vout[i].nValue = 10000;
    }
    return MakeTransactionRef(mtx);
}